

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
Hpipe::Vec<std::__cxx11::string>::push_back_unique<char_const(&)[244]>
          (Vec<std::__cxx11::string> *this,char (*val) [244])

{
  bool bVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  uint local_24;
  uint i;
  char (*val_local) [244];
  Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_local;
  
  local_24 = 0;
  while( true ) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)this);
    if (sVar2 <= local_24) {
      pbVar3 = push_back<char_const(&)[244]>(this,val);
      return pbVar3;
    }
    pbVar3 = Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
             operator[]((Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)this,local_24);
    bVar1 = std::operator==(pbVar3,*val);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  pbVar3 = Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
           operator[]((Vec<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)this,local_24);
  return pbVar3;
}

Assistant:

T       *push_back_unique     ( Arg &&val ) { for( unsigned i = 0; i < this->size(); ++i ) if ( this->operator[]( i ) == val ) return &this->operator[]( i ); return push_back( std::forward<Arg>( val ) ); }